

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

bool __thiscall
dynamicgraph::SignalPtr<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::needUpdate
          (SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,int *t)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  SignalBase<int> *pSVar4;
  int *t_local;
  SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this_local;
  
  uVar2 = (*this->_vptr_SignalPtr[6])();
  if (((uVar2 & 1) == 0) || (bVar1 = autoref(this), bVar1)) {
    this_local._7_1_ =
         SignalBase<int>::needUpdate
                   ((SignalBase<int> *)
                    ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]),t);
  }
  else {
    pSVar4 = getAbstractPtr(this);
    iVar3 = (*pSVar4->_vptr_SignalBase[9])(pSVar4,t);
    this_local._7_1_ = (bool)((byte)iVar3 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool SignalPtr<T, Time>::needUpdate(const Time &t) const {
  if ((isAbstractPluged()) && (!autoref())) {
    return getAbstractPtr()->needUpdate(t);
  } else
    return Signal<T, Time>::needUpdate(t);
}